

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_ssat16_aarch64(CPUARMState_conflict *env,uint32_t x,uint32_t shift)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t res;
  uint32_t shift_local;
  uint32_t x_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = do_ssat(env,(int)(short)x,shift);
  uVar2 = do_ssat(env,(int)x >> 0x10,shift);
  return uVar2 << 0x10 | uVar1 & 0xffff;
}

Assistant:

uint32_t HELPER(ssat16)(CPUARMState *env, uint32_t x, uint32_t shift)
{
    uint32_t res;

    res = (uint16_t)do_ssat(env, (int16_t)x, shift);
    res |= do_ssat(env, ((int32_t)x) >> 16, shift) << 16;
    return res;
}